

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall higan::Buffer::CopyExDataToBuffer(Buffer *this,char *exbuffer,size_t ex_len)

{
  pointer pcVar1;
  ulong uVar2;
  size_t __n;
  size_t sVar3;
  
  sVar3 = this->read_idx_;
  uVar2 = sVar3 - 8;
  if (uVar2 < ex_len) {
    std::vector<char,_std::allocator<char>_>::resize
              (&this->buffer_,
               (size_type)
               ((this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (ex_len - (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
    sVar3 = this->write_idx_;
  }
  else {
    __n = this->write_idx_ - sVar3;
    if (__n != 0) {
      pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar1 + 8,pcVar1 + sVar3,__n);
      sVar3 = this->write_idx_;
    }
    sVar3 = sVar3 - uVar2;
    this->write_idx_ = sVar3;
    this->read_idx_ = 8;
    if (ex_len == 0) goto LAB_0010db8a;
  }
  memmove((this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start + sVar3,exbuffer,ex_len);
  sVar3 = this->write_idx_;
LAB_0010db8a:
  uVar2 = (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar3 + ex_len < uVar2) {
    uVar2 = sVar3 + ex_len;
  }
  this->write_idx_ = uVar2;
  return;
}

Assistant:

void Buffer::CopyExDataToBuffer(const char* exbuffer, size_t ex_len)
{

	size_t drop_len = read_idx_ - DEFAULT_READ_INDEX;
	/**
	 * 可以将已读的内容丢弃来 从远buffer_中得到足够的空间
	 * 无法得到则扩容
	 */
	if (drop_len >= ex_len)
	{
		std::copy(ReadBegin(), ReadBegin() + ReadableSize(), &buffer_[DEFAULT_READ_INDEX]);

		write_idx_ -= drop_len;
		read_idx_ = DEFAULT_READ_INDEX;
	}
	else
	{
		buffer_.resize(buffer_.size() + ex_len);
	}

	std::copy(exbuffer, exbuffer + ex_len, WriteBegin());
	AddWriteIndex(ex_len);
}